

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matching.cc
# Opt level: O0

void features::Matching::combine_results(Result *sift_result,Result *surf_result,Result *result)

{
  size_t sVar1;
  size_type sVar2;
  size_type sVar3;
  vector<int,std::allocator<int>> *pvVar4;
  const_iterator __first;
  const_iterator __last;
  reference pvVar5;
  ulong local_f0;
  size_t i_1;
  size_t i;
  size_t surf_offset_2;
  size_t surf_offset_1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_b8;
  const_iterator local_b0;
  int *local_a8;
  int *local_a0;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_98;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_90;
  const_iterator local_88;
  int *local_80;
  int *local_78;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_70;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_68;
  const_iterator local_60;
  int *local_58;
  int *local_50;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_48;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  const_iterator local_38;
  size_type local_30;
  size_t num_matches_2;
  size_t num_matches_1;
  Result *result_local;
  Result *surf_result_local;
  Result *sift_result_local;
  
  num_matches_1 = (size_t)result;
  result_local = surf_result;
  surf_result_local = sift_result;
  sVar2 = std::vector<int,_std::allocator<int>_>::size(&sift_result->matches_1_2);
  sVar3 = std::vector<int,_std::allocator<int>_>::size(&result_local->matches_1_2);
  num_matches_2 = sVar2 + sVar3;
  sVar2 = std::vector<int,_std::allocator<int>_>::size(&surf_result_local->matches_2_1);
  local_30 = std::vector<int,_std::allocator<int>_>::size(&result_local->matches_2_1);
  local_30 = sVar2 + local_30;
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)num_matches_1);
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)num_matches_1,num_matches_2);
  sVar1 = num_matches_1;
  local_40._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::end
                        ((vector<int,_std::allocator<int>_> *)num_matches_1);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_38,
             &local_40);
  local_48._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin(&surf_result_local->matches_1_2);
  local_50 = (int *)std::vector<int,_std::allocator<int>_>::end(&surf_result_local->matches_1_2);
  local_58 = (int *)std::vector<int,std::allocator<int>>::
                    insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,void>
                              ((vector<int,std::allocator<int>> *)sVar1,local_38,local_48,
                               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                )local_50);
  sVar1 = num_matches_1;
  local_68._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::end
                        ((vector<int,_std::allocator<int>_> *)num_matches_1);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_60,
             &local_68);
  local_70._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin(&result_local->matches_1_2);
  local_78 = (int *)std::vector<int,_std::allocator<int>_>::end(&result_local->matches_1_2);
  local_80 = (int *)std::vector<int,std::allocator<int>>::
                    insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,void>
                              ((vector<int,std::allocator<int>> *)sVar1,local_60,local_70,
                               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                )local_78);
  std::vector<int,_std::allocator<int>_>::clear
            ((vector<int,_std::allocator<int>_> *)(num_matches_1 + 0x18));
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)(num_matches_1 + 0x18),local_30);
  pvVar4 = (vector<int,std::allocator<int>> *)(num_matches_1 + 0x18);
  local_90._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::end
                        ((vector<int,_std::allocator<int>_> *)(num_matches_1 + 0x18));
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_88,
             &local_90);
  local_98._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin(&surf_result_local->matches_2_1);
  local_a0 = (int *)std::vector<int,_std::allocator<int>_>::end(&surf_result_local->matches_2_1);
  local_a8 = (int *)std::vector<int,std::allocator<int>>::
                    insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,void>
                              (pvVar4,local_88,local_98,
                               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                )local_a0);
  pvVar4 = (vector<int,std::allocator<int>> *)(num_matches_1 + 0x18);
  local_b8._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::end
                        ((vector<int,_std::allocator<int>_> *)(num_matches_1 + 0x18));
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_b0,
             &local_b8);
  __first = std::vector<int,_std::allocator<int>_>::begin(&result_local->matches_2_1);
  __last = std::vector<int,_std::allocator<int>_>::end(&result_local->matches_2_1);
  std::vector<int,std::allocator<int>>::
  insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,void>
            (pvVar4,local_b0,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             __first._M_current,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             __last._M_current);
  sVar2 = std::vector<int,_std::allocator<int>_>::size(&surf_result_local->matches_1_2);
  local_f0 = std::vector<int,_std::allocator<int>_>::size(&surf_result_local->matches_2_1);
  i_1 = sVar2;
  if (local_f0 != 0) {
    for (; sVar3 = std::vector<int,_std::allocator<int>_>::size
                             ((vector<int,_std::allocator<int>_> *)num_matches_1), i_1 < sVar3;
        i_1 = i_1 + 1) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)num_matches_1,i_1);
      if (-1 < *pvVar5) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)num_matches_1,i_1);
        *pvVar5 = *pvVar5 + (int)local_f0;
      }
    }
  }
  if (sVar2 != 0) {
    for (; sVar3 = std::vector<int,_std::allocator<int>_>::size
                             ((vector<int,_std::allocator<int>_> *)(num_matches_1 + 0x18)),
        local_f0 < sVar3; local_f0 = local_f0 + 1) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(num_matches_1 + 0x18),local_f0);
      if (-1 < *pvVar5) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(num_matches_1 + 0x18),local_f0);
        *pvVar5 = *pvVar5 + (int)sVar2;
      }
    }
  }
  return;
}

Assistant:

void
Matching::combine_results(Matching::Result const& sift_result,
    Matching::Result const& surf_result, Matching::Result* result)
{
    /* Determine size of combined matching result. */
    std::size_t num_matches_1 = sift_result.matches_1_2.size()
        + surf_result.matches_1_2.size();
    std::size_t num_matches_2 = sift_result.matches_2_1.size()
        + surf_result.matches_2_1.size();

    /* Combine results. */
    result->matches_1_2.clear();
    result->matches_1_2.reserve(num_matches_1);
    result->matches_1_2.insert(result->matches_1_2.end(),
        sift_result.matches_1_2.begin(), sift_result.matches_1_2.end());
    result->matches_1_2.insert(result->matches_1_2.end(),
        surf_result.matches_1_2.begin(), surf_result.matches_1_2.end());

    result->matches_2_1.clear();
    result->matches_2_1.reserve(num_matches_2);
    result->matches_2_1.insert(result->matches_2_1.end(),
        sift_result.matches_2_1.begin(), sift_result.matches_2_1.end());
    result->matches_2_1.insert(result->matches_2_1.end(),
        surf_result.matches_2_1.begin(), surf_result.matches_2_1.end());

    /* Fix offsets. */
    std::size_t surf_offset_1 = sift_result.matches_1_2.size();
    std::size_t surf_offset_2 = sift_result.matches_2_1.size();

    if (surf_offset_2 > 0)
        for (std::size_t i = surf_offset_1; i < result->matches_1_2.size(); ++i)
            if (result->matches_1_2[i] >= 0)
                result->matches_1_2[i] += surf_offset_2;

    if (surf_offset_1 > 0)
        for (std::size_t i = surf_offset_2; i < result->matches_2_1.size(); ++i)
            if (result->matches_2_1[i] >= 0)
                result->matches_2_1[i] += surf_offset_1;

}